

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O3

void learn_bandit_adf(warm_cb *data,multi_learner *base,example *ec,int ec_type)

{
  uint64_t *puVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  pointer ppeVar5;
  uint uVar6;
  pointer ppeVar7;
  ulong uVar8;
  float *__args;
  ulong uVar9;
  multi_ex *__range1;
  float fVar10;
  vector<float,_std::allocator<float>_> old_weights;
  void *local_48;
  iterator iStack_40;
  float *local_38;
  
  copy_example_to_adf(data,ec);
  v_array<CB::cb_class>::push_back
            ((v_array<CB::cb_class> *)
             &((data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start[(data->cl_adf).action - 1]->l).simple,&data->cl_adf)
  ;
  local_48 = (void *)0x0;
  iStack_40._M_current = (float *)0x0;
  local_38 = (float *)0x0;
  if (data->num_actions == 0) {
    uVar6 = 0;
  }
  else {
    uVar9 = 0;
    do {
      __args = &(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9]->weight;
      if (iStack_40._M_current == local_38) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_48,iStack_40,__args);
      }
      else {
        *iStack_40._M_current = *__args;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      uVar9 = uVar9 + 1;
      uVar6 = data->num_actions;
    } while (uVar9 < uVar6);
  }
  if (data->choices_lambda != 0) {
    uVar9 = 0;
    do {
      uVar6 = data->ws_train_size;
      uVar3 = data->inter_period;
      fVar2 = (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      fVar10 = 1.0 - fVar2;
      if (ec_type != 1) {
        fVar10 = fVar2;
      }
      if (data->num_actions != 0) {
        uVar8 = 0;
        do {
          (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8]->weight =
               *(float *)((long)local_48 + uVar8 * 4) *
               ((((float)uVar6 + (float)uVar3) * fVar10) /
               ((1.0 - fVar2) * (float)uVar6 + fVar2 * (float)uVar3 + 1.1754944e-38));
          uVar8 = uVar8 + 1;
        } while (uVar8 < data->num_actions);
      }
      ppeVar7 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppeVar5 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppeVar7 != ppeVar5) {
        iVar4 = *(int *)(base + 0xe0);
        do {
          puVar1 = &((*ppeVar7)->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(iVar4 * (int)uVar9);
          ppeVar7 = ppeVar7 + 1;
        } while (ppeVar7 != ppeVar5);
      }
      (**(code **)(base + 0x28))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&data->ecs);
      ppeVar7 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppeVar5 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppeVar7 != ppeVar5) {
        iVar4 = *(int *)(base + 0xe0);
        do {
          puVar1 = &((*ppeVar7)->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(iVar4 * (int)uVar9);
          ppeVar7 = ppeVar7 + 1;
        } while (ppeVar7 != ppeVar5);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < data->choices_lambda);
    uVar6 = data->num_actions;
  }
  if (uVar6 == 0) {
    if (local_48 == (void *)0x0) {
      return;
    }
  }
  else {
    uVar9 = 0;
    do {
      (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9]->weight = *(float *)((long)local_48 + uVar9 * 4);
      uVar9 = uVar9 + 1;
    } while (uVar9 < data->num_actions);
  }
  operator_delete(local_48);
  return;
}

Assistant:

void learn_bandit_adf(warm_cb& data, multi_learner& base, example& ec, int ec_type)
{
	copy_example_to_adf(data, ec);

  // add cb label to chosen action
	auto& cl = data.cl_adf;
  auto& lab = data.ecs[cl.action - 1]->l.cb;
  lab.costs.push_back(cl);

	vector<float> old_weights;
	for (size_t a = 0; a < data.num_actions; ++a)
		old_weights.push_back(data.ecs[a]->weight);

	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		float weight_multiplier = compute_weight_multiplier(data, i, ec_type);
	  for (size_t a = 0; a < data.num_actions; ++a)
			data.ecs[a]->weight = old_weights[a] * weight_multiplier;
	  base.learn(data.ecs, i);
	}

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->weight = old_weights[a];
}